

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_matcher.hpp
# Opt level: O0

void __thiscall
boost::xpressive::detail::
string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>_>
::string_matcher(string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>_>
                 *this,string_type *str,
                regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  bool bVar1;
  char cVar2;
  reference pcVar3;
  char *pcVar4;
  undefined8 in_RDX;
  string *in_RSI;
  string *in_RDI;
  type end;
  type cur;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  undefined8 local_18;
  
  local_18 = in_RDX;
  std::__cxx11::string::string(in_RDI,in_RSI);
  *(undefined8 *)(in_RDI + 0x20) = 0;
  local_20._M_current =
       (char *)range_adl_barrier::begin<std::__cxx11::string>(in_stack_ffffffffffffff88);
  range_adl_barrier::end<std::__cxx11::string>(in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_20);
    cVar2 = translate<char,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                      ((int)*pcVar3,local_18);
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_20);
    *pcVar3 = cVar2;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_20);
  }
  pcVar4 = data_end<char,std::char_traits<char>,std::allocator<char>>(in_stack_ffffffffffffff90);
  *(char **)(in_RDI + 0x20) = pcVar4;
  return;
}

Assistant:

string_matcher(string_type const &str, Traits const &tr)
          : str_(str)
          , end_()
        {
            typename range_iterator<string_type>::type cur = boost::begin(this->str_);
            typename range_iterator<string_type>::type end = boost::end(this->str_);
            for(; cur != end; ++cur)
            {
                *cur = detail::translate(*cur, tr, icase_type());
            }
            this->end_ = detail::data_end(str_);
        }